

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

Result emulator_write_ext_ram_to_file(Emulator *e,char *filename)

{
  size_t __size;
  Result RVar1;
  FileData file_data;
  FileData local_38;
  
  RVar1 = OK;
  if ((e->state).ext_ram.battery_type == BATTERY_TYPE_WITH_BATTERY) {
    __size = (e->state).ext_ram.size;
    local_38.size = __size;
    local_38.data = (u8 *)malloc(__size);
    memcpy(local_38.data,&(e->state).ext_ram,__size);
    RVar1 = file_write(filename,&local_38);
    RVar1 = (Result)(RVar1 != OK);
    file_data_delete(&local_38);
  }
  return RVar1;
}

Assistant:

Result emulator_write_ext_ram_to_file(Emulator* e, const char* filename) {
  if (EXT_RAM.battery_type != BATTERY_TYPE_WITH_BATTERY)
    return OK;

  Result result = ERROR;
  FileData file_data;
  file_data.size = EXT_RAM.size;
  file_data.data = xmalloc(file_data.size);
  CHECK(SUCCESS(emulator_write_ext_ram(e, &file_data)));
  CHECK(SUCCESS(file_write(filename, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}